

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int TestRegRegEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                      _func_int_uchar_ptr_x86Reg_x86Reg *fun)

{
  x86Reg reg1;
  x86Reg reg2;
  int iVar1;
  long lVar2;
  long lVar3;
  uchar *puVar4;
  int local_48;
  
  puVar4 = stream;
  for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
    reg1 = testRegs[lVar2];
    for (lVar3 = 0; lVar3 != 0x24; lVar3 = lVar3 + 4) {
      reg2 = *(x86Reg *)((long)testRegs + lVar3);
      EMIT_OP_REG_REG(ctx,op,reg1,reg2);
      iVar1 = (*fun)(puVar4,reg1,reg2);
      puVar4 = puVar4 + iVar1;
    }
  }
  local_48 = (int)stream;
  return (int)puVar4 - local_48;
}

Assistant:

int TestRegRegEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg dst, x86Reg src))
{
	unsigned char *start = stream;

	for(unsigned reg1 = 0; reg1 < sizeof(testRegs) / sizeof(testRegs[0]); reg1++)
	{
		for(unsigned reg2 = 0; reg2 < sizeof(testRegs) / sizeof(testRegs[0]); reg2++)
		{
			EMIT_OP_REG_REG(ctx, op, testRegs[reg1], testRegs[reg2]);
			stream += fun(stream, testRegs[reg1], testRegs[reg2]);
		}
	}

	return int(stream - start);
}